

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_data.cc
# Opt level: O3

void __thiscall
re2c::Node::cover<unsigned_char,unsigned_short>
          (Node *this,path_t *prefix,FILE *input,FILE *keys,covers_t *size)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  rule_t rVar3;
  pointer ppvVar4;
  pointer ppvVar5;
  pointer puVar6;
  pointer puVar7;
  bool bVar8;
  byte bVar9;
  path_t *ppVar10;
  undefined1 *__ptr;
  _Rb_tree_node_base *p_Var11;
  long lVar12;
  ulong uVar13;
  ulong count;
  size_t buffer_size;
  undefined1 *puVar14;
  undefined1 *puVar15;
  ulong len;
  ulong uVar16;
  path_t new_prefix;
  path_t local_68;
  
  bVar8 = end(this);
  ppVar10 = this->suffix;
  if (bVar8) {
    if (ppVar10 == (path_t *)0x0) {
      ppVar10 = (path_t *)operator_new(0x38);
      rVar3 = this->rule;
      bVar8 = this->ctx;
      (ppVar10->arcs).
      super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (ppVar10->arcs).
      super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (ppVar10->arcs).
      super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ppVar10->rule = rVar3;
      ppVar10->rule_pos = 0;
      ppVar10->ctx = bVar8;
      ppVar10->ctx_pos = 0;
      this->suffix = ppVar10;
    }
  }
  else if (ppVar10 == (path_t *)0x0) {
    bVar9 = this->loop;
    if (1 < bVar9) {
      return;
    }
    this->loop = bVar9 + 1;
    p_Var11 = (this->arcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->arcs)._M_t._M_impl.super__Rb_tree_header;
    if (((_Rb_tree_header *)p_Var11 != p_Var1) && (size->value != 0x40000000)) {
      do {
        std::
        vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
        ::vector(&local_68.arcs,&prefix->arcs);
        local_68.rule = prefix->rule;
        local_68.rule_pos = prefix->rule_pos;
        local_68.ctx = prefix->ctx;
        local_68._41_7_ = *(undefined7 *)&prefix->field_0x29;
        local_68.ctx_pos = prefix->ctx_pos;
        path_t::extend(&local_68,*(rule_t *)(*(long *)(p_Var11 + 1) + 100),
                       *(bool *)(*(long *)(p_Var11 + 1) + 0x6c),(arc_t *)&p_Var11[1]._M_parent);
        cover<unsigned_char,unsigned_short>(*(Node **)(p_Var11 + 1),&local_68,input,keys,size);
        if ((*(long *)(*(long *)(p_Var11 + 1) + 0xa8) != 0) && (this->suffix == (path_t *)0x0)) {
          ppVar10 = (path_t *)operator_new(0x38);
          rVar3 = this->rule;
          bVar8 = this->ctx;
          (ppVar10->arcs).
          super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (ppVar10->arcs).
          super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (ppVar10->arcs).
          super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          ppVar10->rule = rVar3;
          ppVar10->rule_pos = 0;
          ppVar10->ctx = bVar8;
          ppVar10->ctx_pos = 0;
          this->suffix = ppVar10;
          path_t::extend(ppVar10,*(rule_t *)(*(long *)(p_Var11 + 1) + 100),
                         *(bool *)(*(long *)(p_Var11 + 1) + 0x6c),(arc_t *)&p_Var11[1]._M_parent);
          path_t::append(this->suffix,*(path_t **)(*(long *)(p_Var11 + 1) + 0xa8));
        }
        if (local_68.arcs.
            super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_68.arcs.
                          super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_68.arcs.
                                super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_68.arcs.
                                super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
      } while (((_Rb_tree_header *)p_Var11 != p_Var1) && (size->value != 0x40000000));
      bVar9 = this->loop - 1;
    }
    this->loop = bVar9;
    return;
  }
  path_t::append(prefix,ppVar10);
  ppvVar4 = (prefix->arcs).
            super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppvVar5 = (prefix->arcs).
            super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  len = (long)ppvVar5 - (long)ppvVar4 >> 3;
  uVar2 = size->value;
  if (ppvVar5 == ppvVar4) {
    count = 0;
  }
  else {
    lVar12 = 0;
    count = 0;
    do {
      uVar16 = (long)(ppvVar4[lVar12]->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(ppvVar4[lVar12]->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2;
      if (uVar16 < count) {
        uVar16 = count;
      }
      count = uVar16;
      lVar12 = lVar12 + 1;
    } while (len + (len == 0) != lVar12);
  }
  uVar16 = 0x40000000;
  if (len < 0x40000000) {
    uVar16 = len;
  }
  uVar13 = 0x40000000;
  if (count < 0x40000000) {
    uVar13 = count;
  }
  uVar13 = uVar13 * uVar16;
  uVar16 = 0x40000000;
  if (uVar13 < 0x40000000) {
    __ptr = (undefined1 *)operator_new__(uVar13);
    if (ppvVar5 != ppvVar4) {
      lVar12 = 0;
      puVar14 = __ptr;
      do {
        if (count != 0) {
          puVar6 = (ppvVar4[lVar12]->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          puVar7 = (ppvVar4[lVar12]->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          uVar16 = 0;
          puVar15 = puVar14;
          do {
            *puVar15 = (char)puVar6[uVar16 % (ulong)((long)puVar7 - (long)puVar6 >> 2)];
            uVar16 = uVar16 + 1;
            puVar15 = puVar15 + len;
          } while (count != uVar16);
        }
        lVar12 = lVar12 + 1;
        puVar14 = puVar14 + 1;
      } while (lVar12 != len + (len == 0));
    }
    fwrite(__ptr,1,uVar13,(FILE *)input);
    operator_delete__(__ptr);
    keygen<unsigned_short>
              (keys,count,len,(&prefix->rule_pos)[(ulong)(prefix->rule).restorectx * 2],
               (rule_rank_t)(prefix->rule).rank.value);
    uVar16 = uVar13;
  }
  uVar16 = uVar16 + uVar2;
  if (0x3fffffff < uVar16) {
    uVar16 = 0x40000000;
  }
  size->value = (uint32_t)uVar16;
  return;
}

Assistant:

void Node::cover (path_t & prefix, FILE * input, FILE * keys, covers_t &size)
{
	if (end () && suffix == NULL)
	{
		suffix = new path_t (rule, ctx);
	}
	if (suffix != NULL)
	{
		prefix.append (suffix);
		size = size + cover_one<cunit_t, key_t> (input, keys, prefix);
	}
	else if (loop < 2)
	{
		local_inc _ (loop);
		for (arcs_t::iterator i = arcs.begin ();
			i != arcs.end () && !size.overflow(); ++i)
		{
			path_t new_prefix = prefix;
			new_prefix.extend (i->first->rule, i->first->ctx, &i->second);
			i->first->cover<cunit_t, key_t> (new_prefix, input, keys, size);
			if (i->first->suffix != NULL && suffix == NULL)
			{
				suffix = new path_t (rule, ctx);
				suffix->extend (i->first->rule, i->first->ctx, &i->second);
				suffix->append (i->first->suffix);
			}
		}
	}
}